

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O0

bool google::protobuf::io::Tokenizer::ParseInteger(string *text,uint64_t max_value,uint64_t *output)

{
  int iVar1;
  char *pcVar2;
  int digit_1;
  int digit;
  uint64_t result;
  uint64_t overflow_if_mul_base;
  char *pcStack_30;
  int base;
  char *ptr;
  uint64_t *output_local;
  uint64_t max_value_local;
  string *text_local;
  
  pcStack_30 = (char *)std::__cxx11::string::c_str();
  overflow_if_mul_base._4_4_ = 10;
  result = 0x199999999999999a;
  if (*pcStack_30 == '0') {
    if ((pcStack_30[1] == 'x') || (pcStack_30[1] == 'X')) {
      overflow_if_mul_base._4_4_ = 0x10;
      result = 0x1000000000000000;
      pcStack_30 = pcStack_30 + 2;
    }
    else {
      overflow_if_mul_base._4_4_ = 8;
      result = 0x2000000000000000;
    }
  }
  _digit_1 = 0;
  do {
    if (*pcStack_30 == '\0') goto LAB_01aeb849;
    pcVar2 = pcStack_30 + 1;
    iVar1 = io::anon_unknown_0::DigitValue(*pcStack_30);
    if (overflow_if_mul_base._4_4_ <= iVar1) {
      return false;
    }
    pcStack_30 = pcVar2;
  } while (iVar1 == 0);
  _digit_1 = (ulong)iVar1;
LAB_01aeb849:
  while( true ) {
    if (*pcStack_30 == '\0') {
      if (_digit_1 <= max_value) {
        *output = _digit_1;
      }
      return _digit_1 <= max_value;
    }
    iVar1 = io::anon_unknown_0::DigitValue(*pcStack_30);
    if ((iVar1 < 0) || (overflow_if_mul_base._4_4_ <= iVar1)) {
      return false;
    }
    if (result <= _digit_1) {
      return false;
    }
    _digit_1 = _digit_1 * (long)overflow_if_mul_base._4_4_ + (long)iVar1;
    if (_digit_1 < (ulong)(long)overflow_if_mul_base._4_4_) break;
    pcStack_30 = pcStack_30 + 1;
  }
  return false;
}

Assistant:

bool Tokenizer::ParseInteger(const std::string& text, uint64_t max_value,
                             uint64_t* output) {
  // We can't just use strtoull() because (a) it accepts negative numbers,
  // (b) We want additional range checks, (c) it reports overflows via errno.

#if 0
  const char *str_begin = text.c_str();
  if (*str_begin == '-') return false;
  char *str_end = nullptr;
  errno = 0;
  *output = std::strtoull(str_begin, &str_end, 0);
  return (errno == 0 && str_end && *str_end == '\0' && *output <= max_value);
#endif

  const char* ptr = text.c_str();
  int base = 10;
  uint64_t overflow_if_mul_base = (kuint64max / 10) + 1;
  if (ptr[0] == '0') {
    if (ptr[1] == 'x' || ptr[1] == 'X') {
      // This is hex.
      base = 16;
      overflow_if_mul_base = (kuint64max / 16) + 1;
      ptr += 2;
    } else {
      // This is octal.
      base = 8;
      overflow_if_mul_base = (kuint64max / 8) + 1;
    }
  }

  uint64_t result = 0;
  // For all the leading '0's, and also the first non-zero character, we
  // don't need to multiply.
  while (*ptr != '\0') {
    int digit = DigitValue(*ptr++);
    if (digit >= base) {
      // The token provided by Tokenizer is invalid. i.e., 099 is an invalid
      // token, but Tokenizer still think it's integer.
      return false;
    }
    if (digit != 0) {
      result = digit;
      break;
    }
  }
  for (; *ptr != '\0'; ptr++) {
    int digit = DigitValue(*ptr);
    if (digit < 0 || digit >= base) {
      // The token provided by Tokenizer is invalid. i.e., 099 is an invalid
      // token, but Tokenizer still think it's integer.
      return false;
    }
    if (result >= overflow_if_mul_base) {
      // We know the multiply we're about to do will overflow, so exit now.
      return false;
    }
    // We know that result * base won't overflow, but adding digit might...
    result = result * base + digit;
    // C++ guarantees defined "wrap" semantics when unsigned integer
    // operations overflow, making this a fast way to check if adding
    // digit made result overflow, and thus, wrap around.
    if (result < static_cast<uint64_t>(base)) return false;
  }
  if (result > max_value) return false;

  *output = result;
  return true;
}